

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O3

void __thiscall
ChunkedSequence_OverSizedPushBack_Test::~ChunkedSequence_OverSizedPushBack_Test
          (ChunkedSequence_OverSizedPushBack_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ChunkedSequence, OverSizedPushBack) {
    pstore::chunked_sequence<int, std::size_t{2}, sizeof (int) * 2> cs;
    int const & a = cs.push_back (17);
    int const & b = cs.push_back (19);
    int const & c = cs.push_back (23);
    EXPECT_EQ (cs.size (), 3U);
    EXPECT_EQ (a, 17);
    EXPECT_EQ (b, 19);
    EXPECT_EQ (c, 23);
    EXPECT_THAT (cs, testing::ElementsAre (17, 19, 23));
}